

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

Type * slang::ast::Type::getPredefinedType(Compilation *compilation,SyntaxKind kind,bool isSigned)

{
  PredefinedIntegerType *pPVar1;
  bool local_9;
  
  local_9 = isSigned;
  pPVar1 = (PredefinedIntegerType *)Compilation::getType(compilation,kind);
  if (local_9 != (pPVar1->super_IntegralType).isSigned) {
    if ((pPVar1->super_IntegralType).super_Type.super_Symbol.kind == ScalarType) {
      pPVar1 = (PredefinedIntegerType *)
               BumpAllocator::
               emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pPVar1->integerKind,&local_9);
    }
    else {
      pPVar1 = BumpAllocator::
               emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pPVar1->integerKind,&local_9);
    }
  }
  return (Type *)pPVar1;
}

Assistant:

const Type& Type::getPredefinedType(Compilation& compilation, SyntaxKind kind, bool isSigned) {
    auto& predef = compilation.getType(kind).as<IntegralType>();
    if (isSigned == predef.isSigned)
        return predef;

    if (predef.kind == SymbolKind::ScalarType)
        return *compilation.emplace<ScalarType>(predef.as<ScalarType>().scalarKind, isSigned);

    return *compilation.emplace<PredefinedIntegerType>(
        predef.as<PredefinedIntegerType>().integerKind, isSigned);
}